

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G2.c
# Opt level: O3

int G2_is_on_curve(G2 *op,ATE_CTX *ctx)

{
  fp_struct_st *pfVar1;
  fp2_struct_st *pfVar2;
  fp_struct_st *pfVar3;
  fp_struct_st *pfVar4;
  int iVar5;
  fp_struct_st *pfVar6;
  fp_t tmp2;
  fp_t tmp3;
  fp_t tmp3_1;
  fp2_t tx;
  fp2_t ty;
  fp2_t b;
  G2 tmp;
  undefined1 auStack_218 [32];
  fp_struct_st local_1f8;
  undefined1 local_1d8 [32];
  fp2_struct_st local_1b8;
  fp2_struct_st local_178;
  fp2_struct_st local_138;
  G2 local_f0;
  
  G2_set(&local_f0,op);
  G2_makeaffine(&local_f0,ctx);
  fp2_setzero(&local_138);
  fp_set(local_138.m_a,ctx->b);
  pfVar2 = local_f0.m_y;
  pfVar3 = local_f0.m_y[0].m_b;
  pfVar1 = ctx->p;
  pfVar6 = ctx->n0;
  bn_mul_mont(&local_1b8,pfVar2,pfVar3,pfVar1,pfVar6,4);
  fp_add(auStack_218,pfVar2,pfVar3,pfVar1);
  fp_double(&local_1f8,pfVar2,pfVar1);
  pfVar4 = local_178.m_b;
  fp_sub(pfVar4,pfVar3,&local_1f8,pfVar1);
  bn_mul_mont(pfVar4,pfVar4,auStack_218,pfVar1,pfVar6,4);
  fp_sub(pfVar4,pfVar4,&local_1b8,pfVar1);
  fp_double(auStack_218,&local_1b8,pfVar1);
  fp_add(pfVar4,pfVar4,auStack_218,pfVar1);
  fp_double(&local_178,&local_1b8,pfVar1);
  pfVar3 = local_f0.m_x[0].m_b;
  bn_mul_mont(auStack_218,&local_f0,pfVar3,pfVar1,pfVar6,4);
  fp_add(&local_1f8,&local_f0,pfVar3,pfVar1);
  fp_double(local_1d8,&local_f0,pfVar1);
  pfVar4 = local_1b8.m_b;
  fp_sub(pfVar4,pfVar3,local_1d8,pfVar1);
  bn_mul_mont(pfVar4,pfVar4,&local_1f8,pfVar1,pfVar6,4);
  fp_sub(pfVar4,pfVar4,auStack_218,pfVar1);
  fp_double(&local_1f8,auStack_218,pfVar1);
  fp_add(pfVar4,pfVar4,&local_1f8,pfVar1);
  fp_double(&local_1b8,auStack_218,pfVar1);
  bn_mul_mont(auStack_218,&local_1b8,&local_f0,pfVar1,pfVar6,4);
  pfVar3 = local_f0.m_x[0].m_b;
  bn_mul_mont(&local_1f8,pfVar4,pfVar3,pfVar1,pfVar6,4);
  fp_add(local_1d8,&local_f0,pfVar3,pfVar1);
  fp_add(&local_1b8,&local_1b8,pfVar4,pfVar1);
  fp_set(pfVar4,&local_1f8);
  bn_mul_mont(&local_1b8,&local_1b8,local_1d8,pfVar1,pfVar6,4);
  fp_sub(&local_1b8,&local_1b8,auStack_218,pfVar1);
  fp_sub(&local_1b8,&local_1b8,pfVar4,pfVar1);
  fp_double(auStack_218,auStack_218,pfVar1);
  fp_sub(pfVar4,pfVar4,auStack_218,pfVar1);
  fp_add(&local_1b8,&local_1b8,&local_138,pfVar1);
  fp_add(pfVar4,pfVar4,local_138.m_b,pfVar1);
  iVar5 = fp2_cmp(&local_1b8,&local_178);
  return (int)(iVar5 == 0);
}

Assistant:

int G2_is_on_curve(const G2 *op, const ATE_CTX *ctx)
{
    fp2_t b;
    fp2_t tx, ty;
    G2 tmp;
    G2_set(&tmp, op);
    G2_makeaffine(&tmp, ctx);
    fp2_setzero(b);
    fp_set(b->m_a, ctx->b); /* b*sqrt(-2) */

    fp2_square(ty, tmp.m_y, ctx); /* y^2 */
    fp2_square(tx, tmp.m_x, ctx);
    fp2_mul(tx, tx, tmp.m_x, ctx); /* x^3 */
    fp2_add(tx, tx, b, ctx->p); /* x^3 + b*sqrt(-2) */
    
    return fp2_cmp(tx, ty) == 0;
}